

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex00e2.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  istream *piVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int *piVar11;
  int *piVar12;
  int iVar13;
  long lVar14;
  undefined8 uStack_80;
  int aiStack_78 [2];
  long local_70;
  undefined1 *local_68;
  int *local_60;
  int local_58;
  int local_54;
  int r1;
  int c1;
  uint local_44;
  int local_40;
  int x;
  int r;
  int y;
  int r2;
  int c2;
  
  uStack_80 = 0x101203;
  piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)&local_44);
  uStack_80 = 0x101212;
  std::istream::operator>>(piVar4,&x);
  uStack_80 = 0x10121e;
  std::istream::operator>>((istream *)&std::cin,&local_40);
  _r1 = (ulong)(uint)x;
  lVar3 = -(local_44 * _r1 * 4 + 0xf & 0xfffffffffffffff0);
  piVar11 = (int *)((long)aiStack_78 + lVar3);
  local_68 = (undefined1 *)aiStack_78;
  local_60 = piVar11;
  if (0 < (int)local_44) {
    local_70 = _r1 * 4;
    lVar10 = 0;
    local_68 = (undefined1 *)aiStack_78;
    do {
      if (0 < x) {
        lVar14 = 0;
        piVar12 = piVar11;
        do {
          *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x101282;
          std::istream::operator>>((istream *)&std::cin,piVar12);
          lVar14 = lVar14 + 1;
          piVar12 = piVar12 + 1;
        } while (lVar14 < x);
      }
      lVar10 = lVar10 + 1;
      piVar11 = (int *)((long)piVar11 + local_70);
    } while (lVar10 < (int)local_44);
  }
  if (0 < local_40) {
    lVar10 = _r1 * 4;
    iVar13 = 0;
    do {
      *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x1012da;
      piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_58);
      *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x1012e6;
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_54);
      *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x1012f1;
      piVar4 = (istream *)std::istream::operator>>(piVar4,&r);
      *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x1012fc;
      std::istream::operator>>(piVar4,&y);
      if ((r < local_58) || (y < local_54)) {
        lVar14 = 8;
        poVar7 = (ostream *)&std::cout;
        pcVar6 = "INVALID\n";
LAB_00101321:
        *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x101326;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,lVar14);
      }
      else {
        if (local_54 <= x && local_58 <= (int)local_44) {
          if ((int)local_44 < r) {
            r = local_44;
          }
          if (x < y) {
            y = x;
          }
          iVar5 = local_60[((long)local_58 + -1) * _r1 + (long)local_54 + -1];
          if (local_58 <= r) {
            lVar14 = (long)(int)((long)local_58 + -1);
            lVar8 = lVar10 * lVar14 + (long)(local_54 + -1) * 4 + (long)local_60;
            do {
              if (local_54 <= y) {
                lVar9 = 0;
                do {
                  iVar1 = *(int *)(lVar8 + lVar9 * 4);
                  if (iVar5 < iVar1) {
                    iVar5 = iVar1;
                  }
                  lVar9 = lVar9 + 1;
                } while ((y - local_54) + 1 != (int)lVar9);
              }
              lVar14 = lVar14 + 1;
              lVar8 = lVar8 + lVar10;
            } while (r != (int)lVar14);
          }
          *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x10140e;
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
          lVar14 = 1;
          pcVar6 = "\n";
          goto LAB_00101321;
        }
        *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x101365;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OUTSIDE",7);
        uVar2 = *(undefined8 *)(std::cout + -0x18);
        *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x101379;
        std::ios::widen((char)uVar2 + '8');
        *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x101384;
        std::ostream::put('8');
        *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x10138c;
        std::ostream::flush();
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < local_40);
  }
  return 0;
}

Assistant:

int main() {
    int x, y;
    cin >> x >> y;
    int r, r1, c1, r2, c2;
    cin >> r;
    int arr[x][y];
    for (int i = 0; i < x; i++) {
        for (int j = 0; j < y; j++) {
            cin >> arr[i][j];
        }
    }

    for (int i = 0; i < r; i++) {
        cin >> r1 >> c1 >> r2 >> c2;
        if (r1 > r2 || c1 > c2) {
            cout << "INVALID\n";
        } else if (r1 > x || c1 > y) {
            cout << "OUTSIDE" << endl;
        } else {
            if (r2 > x)
                r2 = x;
            if (c2 > y)
                c2 = y;
            int localmax = arr[r1 - 1][c1 - 1];
            for (int i = r1 - 1; i < r2; i++) {
                for (int j = c1 - 1; j < c2; j++) {
                    if (arr[i][j] > localmax) {
                        localmax = arr[i][j];
                    }
                }
            }
            cout << localmax << "\n";
        }
    }
}